

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFactoryRegistry.cpp
# Opt level: O0

AbstractFactory * __thiscall
tcu::GenericFactoryRegistry::getFactoryByName(GenericFactoryRegistry *this,string *name)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppAVar4;
  undefined4 extraout_var;
  ulong local_28;
  size_t index;
  string *name_local;
  GenericFactoryRegistry *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar3 = std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>::size
                      (&this->m_factories);
    if (sVar3 <= local_28) {
      return (AbstractFactory *)0x0;
    }
    ppAVar4 = std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>::
              operator[](&this->m_factories,local_28);
    iVar2 = (*(*ppAVar4)->_vptr_AbstractFactory[2])();
    bVar1 = std::operator==(name,(char *)CONCAT44(extraout_var,iVar2));
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  ppAVar4 = std::vector<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>::operator[]
                      (&this->m_factories,local_28);
  return *ppAVar4;
}

Assistant:

AbstractFactory* GenericFactoryRegistry::getFactoryByName (const std::string& name)
{
	for (size_t index = 0; index < m_factories.size(); index++)
	{
		if (name == m_factories[index]->getName())
			return m_factories[index];
	}

	return DE_NULL;
}